

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-from-text.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonValBuilder::
_handleVal<std::map<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>>
          (JsonValBuilder *this,TextLocation *loc,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
          *args)

{
  pointer p_Var1;
  TextLocation loc_00;
  undefined1 auVar2 [8];
  _Alloc_hider _Var3;
  Up jsonVal;
  undefined1 local_60 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonObjVal,_std::default_delete<const_yactfr::internal::JsonObjVal>_>_>
  local_58;
  TextLocation local_30;
  
  TextLocation::TextLocation
            (&local_30,this->_baseOffset + loc->_offset,loc->_lineNumber,loc->_colNumber);
  loc_00._lineNumber = local_30._lineNumber;
  loc_00._offset = local_30._offset;
  loc_00._colNumber = local_30._colNumber;
  createJsonVal((Container *)local_60,loc_00);
  auVar2 = local_60;
  p_Var1 = (this->_stack).
           super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->_stack).
      super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
      ._M_impl.super__Vector_impl_data._M_start == p_Var1) {
    local_60 = (undefined1  [8])0x0;
    _Var3._M_p = (pointer)(this->_jsonVal)._M_t.
                          super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
                          .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>.
                          _M_head_impl;
    (this->_jsonVal)._M_t.
    super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
    .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl =
         (JsonVal *)auVar2;
  }
  else {
    if (p_Var1[-1].state == InObj) {
      std::__cxx11::string::string((string *)&local_58,(string *)&p_Var1[-1].lastObjKey);
      local_58.second._M_t.
      super___uniq_ptr_impl<const_yactfr::internal::JsonObjVal,_std::default_delete<const_yactfr::internal::JsonObjVal>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::internal::JsonObjVal_*,_std::default_delete<const_yactfr::internal::JsonObjVal>_>
      .super__Head_base<0UL,_const_yactfr::internal::JsonObjVal_*,_false>._M_head_impl =
           (__uniq_ptr_data<const_yactfr::internal::JsonObjVal,_std::default_delete<const_yactfr::internal::JsonObjVal>,_true,_true>
            )(__uniq_ptr_data<const_yactfr::internal::JsonObjVal,_std::default_delete<const_yactfr::internal::JsonObjVal>,_true,_true>
              )local_60;
      local_60 = (undefined1  [8])0x0;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonObjVal_const,std::default_delete<yactfr::internal::JsonObjVal_const>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
                  *)&p_Var1[-1].objValCont,&local_58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonObjVal,_std::default_delete<const_yactfr::internal::JsonObjVal>_>_>
      ::~pair(&local_58);
      goto LAB_0027afc8;
    }
    if (p_Var1[-1].state != InArray) {
      abort();
    }
    local_60 = (undefined1  [8])0x0;
    local_58.first._M_dataplus._M_p = (pointer)auVar2;
    std::
    vector<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::allocator<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>
    ::
    emplace_back<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>
              ((vector<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::allocator<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>
                *)&p_Var1[-1].arrayValCont,
               (unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                *)&local_58);
    _Var3._M_p = local_58.first._M_dataplus._M_p;
  }
  if ((JsonVal *)_Var3._M_p != (JsonVal *)0x0) {
    (*((JsonVal *)_Var3._M_p)->_vptr_JsonVal[1])();
  }
LAB_0027afc8:
  std::
  unique_ptr<const_yactfr::internal::JsonObjVal,_std::default_delete<const_yactfr::internal::JsonObjVal>_>
  ::~unique_ptr((unique_ptr<const_yactfr::internal::JsonObjVal,_std::default_delete<const_yactfr::internal::JsonObjVal>_>
                 *)local_60);
  return;
}

Assistant:

void _handleVal(const TextLocation& loc, ArgTs&&... args)
    {
        auto jsonVal = createJsonVal(std::forward<ArgTs>(args)..., TextLocation {
            loc.offset() + _baseOffset, loc.lineNumber(), loc.columnNumber()
        });

        if (_stack.empty()) {
            _jsonVal = std::move(jsonVal);
            return;
        }

        switch (_stack.back().state) {
        case _tState::InArray:
            this->_stackTop().arrayValCont.push_back(std::move(jsonVal));
            break;

        case _tState::InObj:
             // safe to move `lastObjKey`: only used once
            this->_stackTop().objValCont.insert(std::make_pair(std::move(this->_stackTop().lastObjKey),
                                                               std::move(jsonVal)));
            break;

        default:
            std::abort();
        }
    }